

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O2

char * name_dot_arc(char *s)

{
  char *pcVar1;
  size_t sVar2;
  char *__filename;
  
  __filename = "";
  if (s != (char *)0x0) {
    __filename = s;
  }
  pcVar1 = basename(__filename);
  sVar2 = strlen(pcVar1);
  if (0xfffffffffffffefe < sVar2 - 0xfd) {
    free(name_dot_arc::newname);
    sVar2 = strlen(__filename);
    pcVar1 = (char *)malloc(sVar2 + 5);
    name_dot_arc::newname = pcVar1;
    if (pcVar1 != (char *)0x0) {
      strcpy(pcVar1,__filename);
      sVar2 = strlen(pcVar1);
      builtin_strncpy(pcVar1 + sVar2,".arc",5);
      __filename = pcVar1;
    }
  }
  return __filename;
}

Assistant:

char *
name_dot_arc(char *s)
{
	static char *newname = NULL;

	if (!s)
		s = "";

	/*
	 * check that there's room for the extension
	 */
	if (strlen(basename(s)) + sizeof(DOTARC) - 1 > FILENAMELEN)
		return (s);

	/*
	 * free previous allocation (hope it's finished with :-/)
	 */
	if (newname)
		free(newname);
	newname = malloc(strlen(s) + sizeof(DOTARC));
	if (!newname)
		return (s);				/* don't complain */
	strcpy(newname, s);
	strcat(newname, DOTARC);
	return (newname);
}